

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-stroker.c
# Opt level: O0

PVG_FT_Error
PVG_FT_Stroker_CubicTo
          (PVG_FT_Stroker stroker,PVG_FT_Vector *control1,PVG_FT_Vector *control2,PVG_FT_Vector *to)

{
  PVG_FT_Bool PVar1;
  PVG_FT_Error PVar2;
  int iVar3;
  PVG_FT_Angle PVar4;
  PVG_FT_Angle PVar5;
  PVG_FT_Angle PVar6;
  PVG_FT_Angle PVar7;
  PVG_FT_Fixed PVar8;
  PVG_FT_Long length;
  PVG_FT_Long PVar9;
  long lVar10;
  PVG_FT_Pos PVar11;
  PVG_FT_Angle PVar12;
  PVG_FT_Fixed PVar13;
  PVG_FT_Pos c;
  PVG_FT_Long length_00;
  PVG_FT_Fixed alen;
  PVG_FT_Fixed sinB;
  PVG_FT_Fixed sinA;
  PVG_FT_Fixed blen;
  PVG_FT_Vector delta;
  PVG_FT_Vector bvec;
  PVG_FT_Angle gamma;
  PVG_FT_Angle beta;
  PVG_FT_Angle alpha1;
  PVG_FT_Vector start;
  PVG_FT_StrokeBorder pPStack_330;
  PVG_FT_Int side;
  PVG_FT_StrokeBorder border;
  PVG_FT_Fixed length2;
  PVG_FT_Fixed length1;
  PVG_FT_Angle alpha0;
  PVG_FT_Angle rotate;
  PVG_FT_Angle phi2;
  PVG_FT_Angle theta2;
  PVG_FT_Angle phi1;
  PVG_FT_Angle theta1;
  PVG_FT_Vector end;
  PVG_FT_Vector ctrl2;
  PVG_FT_Vector ctrl1;
  PVG_FT_Angle angle_out;
  PVG_FT_Angle angle_mid;
  PVG_FT_Angle angle_in;
  PVG_FT_Vector *pPStack_298;
  PVG_FT_Bool first_arc;
  PVG_FT_Vector *limit;
  PVG_FT_Vector *arc;
  PVG_FT_Vector bez_stack [37];
  PVG_FT_Error local_2c;
  PVG_FT_Error error;
  PVG_FT_Vector *to_local;
  PVG_FT_Vector *control2_local;
  PVG_FT_Vector *control1_local;
  PVG_FT_Stroker stroker_local;
  
  local_2c = 0;
  pPStack_298 = (PVG_FT_Vector *)&bez_stack[0x1f].y;
  angle_in._7_1_ = '\x01';
  if (((((((stroker->center).x - control1->x < -1) || (1 < (stroker->center).x - control1->x)) ||
        ((stroker->center).y - control1->y < -1)) ||
       (((1 < (stroker->center).y - control1->y || (control1->x - control2->x < -1)) ||
        ((1 < control1->x - control2->x ||
         ((control1->y - control2->y < -1 || (1 < control1->y - control2->y)))))))) ||
      (control2->x - to->x < -1)) ||
     (((1 < control2->x - to->x || (control2->y - to->y < -1)) || (1 < control2->y - to->y)))) {
    limit = (PVG_FT_Vector *)&arc;
    arc = (PVG_FT_Vector *)to->x;
    bez_stack[0].x = to->y;
    bez_stack[0].y = control2->x;
    bez_stack[1].x = control2->y;
    bez_stack[1].y = control1->x;
    bez_stack[2].x = control1->y;
    bez_stack[2].y = (stroker->center).x;
    bez_stack[3].x = (stroker->center).y;
    while ((PVG_FT_Vector *)&arc <= limit) {
      ctrl1.y = stroker->angle_in;
      angle_out = ctrl1.y;
      angle_mid = ctrl1.y;
      if ((limit < pPStack_298) &&
         (PVar1 = ft_cubic_is_small_enough(limit,&angle_mid,&angle_out,&ctrl1.y), PVar1 == '\0')) {
        if (stroker->first_point != '\0') {
          stroker->angle_in = angle_mid;
        }
        ft_cubic_split(limit);
        limit = limit + 3;
      }
      else {
        if (angle_in._7_1_ == '\0') {
          PVar4 = PVG_FT_Angle_Diff(stroker->angle_in,angle_mid);
          PVar11 = ft_pos_abs(PVar4);
          if (0x5a000 < PVar11) {
            (stroker->center).x = limit[3].x;
            (stroker->center).y = limit[3].y;
            stroker->angle_out = angle_mid;
            stroker->line_join = PVG_FT_STROKER_LINEJOIN_ROUND;
            local_2c = ft_stroker_process_corner(stroker,0);
            stroker->line_join = stroker->line_join_saved;
          }
        }
        else {
          angle_in._7_1_ = '\0';
          if (stroker->first_point == '\0') {
            stroker->angle_out = angle_mid;
            local_2c = ft_stroker_process_corner(stroker,0);
          }
          else {
            local_2c = ft_stroker_subpath_start(stroker,angle_mid,0);
          }
        }
        if (local_2c != 0) {
          return local_2c;
        }
        length1 = 0;
        PVar4 = PVG_FT_Angle_Diff(angle_mid,angle_out);
        PVar5 = PVG_FT_Angle_Diff(angle_out,ctrl1.y);
        PVar6 = ft_angle_mean(angle_mid,angle_out);
        PVar7 = ft_angle_mean(angle_out,ctrl1.y);
        PVar9 = stroker->radius;
        PVar8 = PVG_FT_Cos(PVar4 / 2);
        length = PVG_FT_DivFix(PVar9,PVar8);
        PVar9 = stroker->radius;
        PVar8 = PVG_FT_Cos(PVar5 / 2);
        PVar9 = PVG_FT_DivFix(PVar9,PVar8);
        if (stroker->handle_wide_strokes != '\0') {
          length1 = PVG_FT_Atan2(limit->x - limit[3].x,limit->y - limit[3].y);
        }
        pPStack_330 = stroker->borders;
        for (start.y._4_4_ = 0; start.y._4_4_ < 2; start.y._4_4_ = start.y._4_4_ + 1) {
          lVar10 = (long)start.y._4_4_ * -0xb40000 + 0x5a0000;
          PVG_FT_Vector_From_Polar((PVG_FT_Vector *)&ctrl2.y,length,PVar6 + lVar10);
          ctrl2.y = limit[2].x + ctrl2.y;
          ctrl1.x = limit[2].y + ctrl1.x;
          PVG_FT_Vector_From_Polar((PVG_FT_Vector *)&end.y,PVar9,PVar7 + lVar10);
          end.y = limit[1].x + end.y;
          ctrl2.x = limit[1].y + ctrl2.x;
          PVG_FT_Vector_From_Polar((PVG_FT_Vector *)&theta1,stroker->radius,ctrl1.y + lVar10);
          theta1 = limit->x + theta1;
          end.x = limit->y + end.x;
          if (stroker->handle_wide_strokes == '\0') {
LAB_00184bb7:
            iVar3 = ft_stroke_border_cubicto
                              (pPStack_330,(PVG_FT_Vector *)&ctrl2.y,(PVG_FT_Vector *)&end.y,
                               (PVG_FT_Vector *)&theta1);
          }
          else {
            alpha1 = pPStack_330->points[pPStack_330->num_points - 1].x;
            start.x = pPStack_330->points[pPStack_330->num_points - 1].y;
            PVar4 = PVG_FT_Atan2(theta1 - alpha1,end.x - start.x);
            PVar5 = PVG_FT_Angle_Diff(length1,PVar4);
            PVar11 = ft_pos_abs(PVar5);
            if (PVar11 < 0x5a0001) goto LAB_00184bb7;
            PVar5 = PVG_FT_Atan2(limit[3].x - alpha1,limit[3].y - start.x);
            PVar12 = PVG_FT_Atan2(limit->x - theta1,limit->y - end.x);
            delta.y = theta1 - alpha1;
            PVar8 = PVG_FT_Vector_Length((PVG_FT_Vector *)&delta.y);
            PVar13 = PVG_FT_Sin(PVar4 - PVar12);
            PVar11 = ft_pos_abs(PVar13);
            PVar13 = PVG_FT_Sin(PVar5 - PVar12);
            c = ft_pos_abs(PVar13);
            length_00 = PVG_FT_MulDiv(PVar8,PVar11,c);
            PVG_FT_Vector_From_Polar((PVG_FT_Vector *)&blen,length_00,PVar5);
            blen = alpha1 + blen;
            delta.x = start.x + delta.x;
            pPStack_330->movable = '\0';
            PVar2 = ft_stroke_border_lineto(pPStack_330,(PVG_FT_Vector *)&blen,'\0');
            if (PVar2 != 0) {
              return PVar2;
            }
            PVar2 = ft_stroke_border_lineto(pPStack_330,(PVG_FT_Vector *)&theta1,'\0');
            if (PVar2 != 0) {
              return PVar2;
            }
            PVar2 = ft_stroke_border_cubicto
                              (pPStack_330,(PVG_FT_Vector *)&end.y,(PVG_FT_Vector *)&ctrl2.y,
                               (PVG_FT_Vector *)&alpha1);
            if (PVar2 != 0) {
              return PVar2;
            }
            iVar3 = ft_stroke_border_lineto(pPStack_330,(PVG_FT_Vector *)&theta1,'\0');
          }
          if (iVar3 != 0) {
            return iVar3;
          }
          pPStack_330 = pPStack_330 + 1;
          local_2c = 0;
        }
        limit = limit + -3;
        stroker->angle_in = ctrl1.y;
      }
    }
    (stroker->center).x = to->x;
    (stroker->center).y = to->y;
    stroker->line_length = 0;
  }
  else {
    (stroker->center).x = to->x;
    (stroker->center).y = to->y;
  }
  return local_2c;
}

Assistant:

PVG_FT_Error PVG_FT_Stroker_CubicTo(PVG_FT_Stroker stroker, PVG_FT_Vector* control1,
                                  PVG_FT_Vector* control2, PVG_FT_Vector* to)
{
    PVG_FT_Error   error = 0;
    PVG_FT_Vector  bez_stack[37];
    PVG_FT_Vector* arc;
    PVG_FT_Vector* limit = bez_stack + 32;
    PVG_FT_Bool    first_arc = TRUE;

    /* if all control points are coincident, this is a no-op; */
    /* avoid creating a spurious corner */
    if (PVG_FT_IS_SMALL(stroker->center.x - control1->x) &&
        PVG_FT_IS_SMALL(stroker->center.y - control1->y) &&
        PVG_FT_IS_SMALL(control1->x - control2->x) &&
        PVG_FT_IS_SMALL(control1->y - control2->y) &&
        PVG_FT_IS_SMALL(control2->x - to->x) &&
        PVG_FT_IS_SMALL(control2->y - to->y)) {
        stroker->center = *to;
        goto Exit;
    }

    arc = bez_stack;
    arc[0] = *to;
    arc[1] = *control2;
    arc[2] = *control1;
    arc[3] = stroker->center;

    while (arc >= bez_stack) {
        PVG_FT_Angle angle_in, angle_mid, angle_out;

        /* initialize with current direction */
        angle_in = angle_out = angle_mid = stroker->angle_in;

        if (arc < limit &&
            !ft_cubic_is_small_enough(arc, &angle_in, &angle_mid, &angle_out)) {
            if (stroker->first_point) stroker->angle_in = angle_in;

            ft_cubic_split(arc);
            arc += 3;
            continue;
        }

        if (first_arc) {
            first_arc = FALSE;

            /* process corner if necessary */
            if (stroker->first_point)
                error = ft_stroker_subpath_start(stroker, angle_in, 0);
            else {
                stroker->angle_out = angle_in;
                error = ft_stroker_process_corner(stroker, 0);
            }
        } else if (ft_pos_abs(PVG_FT_Angle_Diff(stroker->angle_in, angle_in)) >
                   PVG_FT_SMALL_CUBIC_THRESHOLD / 4) {
            /* if the deviation from one arc to the next is too great, */
            /* add a round corner                                      */
            stroker->center = arc[3];
            stroker->angle_out = angle_in;
            stroker->line_join = PVG_FT_STROKER_LINEJOIN_ROUND;

            error = ft_stroker_process_corner(stroker, 0);

            /* reinstate line join style */
            stroker->line_join = stroker->line_join_saved;
        }

        if (error) goto Exit;

        /* the arc's angle is small enough; we can add it directly to each */
        /* border                                                          */
        {
            PVG_FT_Vector       ctrl1, ctrl2, end;
            PVG_FT_Angle        theta1, phi1, theta2, phi2, rotate, alpha0 = 0;
            PVG_FT_Fixed        length1, length2;
            PVG_FT_StrokeBorder border;
            PVG_FT_Int          side;

            theta1 = PVG_FT_Angle_Diff(angle_in, angle_mid) / 2;
            theta2 = PVG_FT_Angle_Diff(angle_mid, angle_out) / 2;
            phi1 = ft_angle_mean(angle_in, angle_mid);
            phi2 = ft_angle_mean(angle_mid, angle_out);
            length1 = PVG_FT_DivFix(stroker->radius, PVG_FT_Cos(theta1));
            length2 = PVG_FT_DivFix(stroker->radius, PVG_FT_Cos(theta2));

            /* compute direction of original arc */
            if (stroker->handle_wide_strokes)
                alpha0 = PVG_FT_Atan2(arc[0].x - arc[3].x, arc[0].y - arc[3].y);

            for (border = stroker->borders, side = 0; side <= 1;
                 side++, border++) {
                rotate = PVG_FT_SIDE_TO_ROTATE(side);

                /* compute control points */
                PVG_FT_Vector_From_Polar(&ctrl1, length1, phi1 + rotate);
                ctrl1.x += arc[2].x;
                ctrl1.y += arc[2].y;

                PVG_FT_Vector_From_Polar(&ctrl2, length2, phi2 + rotate);
                ctrl2.x += arc[1].x;
                ctrl2.y += arc[1].y;

                /* compute end point */
                PVG_FT_Vector_From_Polar(&end, stroker->radius,
                                        angle_out + rotate);
                end.x += arc[0].x;
                end.y += arc[0].y;

                if (stroker->handle_wide_strokes) {
                    PVG_FT_Vector start;
                    PVG_FT_Angle  alpha1;

                    /* determine whether the border radius is greater than the
                     */
                    /* radius of curvature of the original arc */
                    start = border->points[border->num_points - 1];

                    alpha1 = PVG_FT_Atan2(end.x - start.x, end.y - start.y);

                    /* is the direction of the border arc opposite to */
                    /* that of the original arc? */
                    if (ft_pos_abs(PVG_FT_Angle_Diff(alpha0, alpha1)) >
                        PVG_FT_ANGLE_PI / 2) {
                        PVG_FT_Angle  beta, gamma;
                        PVG_FT_Vector bvec, delta;
                        PVG_FT_Fixed  blen, sinA, sinB, alen;

                        /* use the sine rule to find the intersection point */
                        beta =
                            PVG_FT_Atan2(arc[3].x - start.x, arc[3].y - start.y);
                        gamma = PVG_FT_Atan2(arc[0].x - end.x, arc[0].y - end.y);

                        bvec.x = end.x - start.x;
                        bvec.y = end.y - start.y;

                        blen = PVG_FT_Vector_Length(&bvec);

                        sinA = ft_pos_abs(PVG_FT_Sin(alpha1 - gamma));
                        sinB = ft_pos_abs(PVG_FT_Sin(beta - gamma));

                        alen = PVG_FT_MulDiv(blen, sinA, sinB);

                        PVG_FT_Vector_From_Polar(&delta, alen, beta);
                        delta.x += start.x;
                        delta.y += start.y;

                        /* circumnavigate the negative sector backwards */
                        border->movable = FALSE;
                        error = ft_stroke_border_lineto(border, &delta, FALSE);
                        if (error) goto Exit;
                        error = ft_stroke_border_lineto(border, &end, FALSE);
                        if (error) goto Exit;
                        error = ft_stroke_border_cubicto(border, &ctrl2, &ctrl1,
                                                         &start);
                        if (error) goto Exit;
                        /* and then move to the endpoint */
                        error = ft_stroke_border_lineto(border, &end, FALSE);
                        if (error) goto Exit;

                        continue;
                    }

                    /* else fall through */
                }

                /* simply add an arc */
                error = ft_stroke_border_cubicto(border, &ctrl1, &ctrl2, &end);
                if (error) goto Exit;
            }
        }

        arc -= 3;

        stroker->angle_in = angle_out;
    }

    stroker->center = *to;
    stroker->line_length = 0;

Exit:
    return error;
}